

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O1

int __thiscall FatSystem::readData(FatSystem *this,unsigned_long_long address,char *buffer,int size)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  
  if ((this->totalSize != 0xffffffffffffffff) && (this->totalSize < (long)size + address)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"! Trying to read outside the disk",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  uVar3 = 0;
  lseek64(this->fd,address + this->globalOffset,0);
  do {
    sVar2 = read(this->fd,buffer + uVar3,(long)size);
    iVar1 = (int)sVar2;
    if (iVar1 < 1) {
      return iVar1;
    }
    size = size - iVar1;
    uVar3 = uVar3 + iVar1;
  } while (0 < size);
  return iVar1;
}

Assistant:

int FatSystem::readData(unsigned long long address, char *buffer, int size)
{
    if (totalSize != -1 && address+size > totalSize) {
        cerr << "! Trying to read outside the disk" << endl;
    }

    lseek64(fd, globalOffset+address, SEEK_SET);

    int n;
    int pos = 0;
    do {
        n = read(fd, buffer+pos, size);

        if (n > 0) {
            pos += n;
            size -= n;
        }
    } while ((size>0) && (n>0));

    return n;
}